

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::PathBezierCurveTo(ImDrawList *this,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,int num_segments)

{
  float x1;
  float y1;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  ImVec2 *pIVar8;
  long lVar9;
  ImVec2 *__dest;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  
  lVar9 = (long)(this->_Path).Size;
  if (lVar9 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sreiter[P]lumeview/deps/imgui/imgui.h"
                  ,0x4a4,"value_type &ImVector<ImVec2>::back() [T = ImVec2]");
  }
  pIVar8 = (this->_Path).Data;
  x1 = pIVar8[lVar9 + -1].x;
  y1 = pIVar8[lVar9 + -1].y;
  if (num_segments == 0) {
    PathBezierToCasteljau
              (&this->_Path,x1,y1,p2->x,p2->y,p3->x,p3->y,p4->x,p4->y,
               this->_Data->CurveTessellationTol,0);
  }
  else if (0 < num_segments) {
    iVar12 = 1;
    do {
      fVar14 = (float)iVar12 * (1.0 / (float)num_segments);
      fVar15 = 1.0 - fVar14;
      fVar17 = fVar15 * fVar15 * 3.0 * fVar14;
      fVar16 = fVar15 * 3.0 * fVar14 * fVar14;
      fVar14 = fVar14 * fVar14 * fVar14;
      fVar1 = p2->x;
      fVar2 = p3->x;
      fVar3 = p4->x;
      fVar4 = p2->y;
      fVar5 = p3->y;
      fVar6 = p4->y;
      iVar11 = (this->_Path).Size;
      iVar7 = (this->_Path).Capacity;
      if (iVar11 == iVar7) {
        if (iVar7 == 0) {
          iVar10 = 8;
        }
        else {
          iVar10 = iVar7 / 2 + iVar7;
        }
        iVar11 = iVar11 + 1;
        if (iVar11 < iVar10) {
          iVar11 = iVar10;
        }
        if (iVar7 < iVar11) {
          __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar11 << 3);
          pIVar8 = (this->_Path).Data;
          if (pIVar8 != (ImVec2 *)0x0) {
            memcpy(__dest,pIVar8,(long)(this->_Path).Size << 3);
          }
          ImGui::MemFree((this->_Path).Data);
          (this->_Path).Data = __dest;
          (this->_Path).Capacity = iVar11;
        }
      }
      fVar15 = fVar15 * fVar15 * fVar15;
      pIVar8 = (this->_Path).Data;
      iVar11 = (this->_Path).Size;
      pIVar8[iVar11].x = fVar3 * fVar14 + fVar2 * fVar16 + fVar15 * x1 + fVar1 * fVar17;
      pIVar8[iVar11].y = fVar14 * fVar6 + fVar16 * fVar5 + fVar15 * y1 + fVar17 * fVar4;
      (this->_Path).Size = (this->_Path).Size + 1;
      bVar13 = iVar12 != num_segments;
      iVar12 = iVar12 + 1;
    } while (bVar13);
  }
  return;
}

Assistant:

void ImDrawList::PathBezierCurveTo(const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, int num_segments)
{
    ImVec2 p1 = _Path.back();
    if (num_segments == 0)
    {
        // Auto-tessellated
        PathBezierToCasteljau(&_Path, p1.x, p1.y, p2.x, p2.y, p3.x, p3.y, p4.x, p4.y, _Data->CurveTessellationTol, 0);
    }
    else
    {
        float t_step = 1.0f / (float)num_segments;
        for (int i_step = 1; i_step <= num_segments; i_step++)
        {
            float t = t_step * i_step;
            float u = 1.0f - t;
            float w1 = u*u*u;
            float w2 = 3*u*u*t;
            float w3 = 3*u*t*t;
            float w4 = t*t*t;
            _Path.push_back(ImVec2(w1*p1.x + w2*p2.x + w3*p3.x + w4*p4.x, w1*p1.y + w2*p2.y + w3*p3.y + w4*p4.y));
        }
    }
}